

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thecl06.c
# Opt level: O2

thecl_t * th06_open(FILE *stream,uint version)

{
  ushort *puVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  float fVar5;
  void *pvVar6;
  int *piVar7;
  double dVar8;
  undefined4 uVar9;
  ushort uVar10;
  uint uVar11;
  size_t length;
  void *map;
  thecl_t *ptVar12;
  undefined8 *data;
  char *pcVar13;
  thecl_instr_t *ptVar14;
  value_t *pvVar15;
  thecl_param_t *ptVar16;
  char *pcVar17;
  uint uVar18;
  size_t d;
  ulong uVar19;
  list_node_t *plVar20;
  ushort *puVar21;
  value_t *pvVar22;
  uint uVar23;
  code *value_from_data;
  long *plVar24;
  list_t *plVar25;
  size_t d_1;
  list_node_t *list;
  list_node_t *list_00;
  int iVar26;
  uint *puVar27;
  ulong uVar28;
  list_node_t *old;
  ulong uStack_1d0;
  uint local_1bc;
  int local_1a8;
  ulong local_198;
  ulong local_190;
  char name [256];
  
  length = file_fsize(stream);
  if ((length == 0xffffffffffffffff) || (map = file_mmap(stream,length), map == (void *)0x0)) {
    return (thecl_t *)0x0;
  }
  puVar1 = (ushort *)((long)map + (ulong)(7 < version) * 4);
  if (version == 6) {
    local_190 = 1;
    uStack_1d0 = 3;
  }
  else {
    if (version == 9) {
      local_198 = (ulong)*(ushort *)((long)map + 6);
      local_190 = local_198;
      goto LAB_00114de9;
    }
    local_190 = (ulong)puVar1[1];
    uStack_1d0 = 0x10;
  }
  local_198 = uStack_1d0;
LAB_00114de9:
  ptVar12 = thecl_new();
  ptVar12->version = version;
  uVar19 = (ulong)*puVar1;
  ptVar12->sub_count = uVar19;
  list_00 = (list_node_t *)&ptVar12->subs;
  for (uVar28 = 0; uVar28 < uVar19; uVar28 = uVar28 + 1) {
    data = (undefined8 *)calloc(1,0x60);
    local_1bc = 0;
    sprintf(name,"Sub%zu",uVar28);
    pcVar13 = strdup(name);
    *data = pcVar13;
    data[3] = 0;
    plVar25 = (list_t *)(data + 7);
    list_init(plVar25);
    list_init((list_t *)(data + 9));
    uVar23 = *(uint *)(puVar1 + (uVar28 + local_198) * 2 + 2);
    uVar4 = 0xff00;
    for (puVar27 = (uint *)((ulong)uVar23 + (long)map);
        (uVar18 = *puVar27, uVar18 != 0xffffffff && (*(short *)((long)puVar27 + 6) != 0));
        puVar27 = (uint *)((long)puVar27 + (ulong)*(ushort *)((long)puVar27 + 6))) {
      iVar26 = (int)puVar27;
      local_1a8 = (int)(uint *)((ulong)uVar23 + (long)map);
      if (uVar18 != local_1bc) {
        ptVar14 = thecl_instr_time(uVar18);
        ptVar14->offset = iVar26 - local_1a8;
        list_append_new(plVar25,ptVar14);
        local_1bc = *puVar27;
      }
      if (uVar4 == (ushort)puVar27[2]) {
        uVar18 = iVar26 - local_1a8;
      }
      else {
        uVar11 = (uint)(ushort)((ushort)puVar27[2] >> 8);
        uVar18 = uVar11 | 0xf0;
        if ((version & 0xfffffffe) != 6) {
          uVar18 = uVar11;
        }
        ptVar14 = thecl_instr_rank(uVar18);
        uVar18 = iVar26 - local_1a8;
        ptVar14->offset = uVar18;
        list_append_new(plVar25,ptVar14);
        uVar4 = (ushort)puVar27[2];
      }
      ptVar14 = thecl_instr_new();
      uVar10 = (ushort)puVar27[1];
      ptVar14->id = (uint)uVar10;
      uVar3 = *(ushort *)((long)puVar27 + 6);
      ptVar14->size = (uint)uVar3;
      ptVar14->offset = uVar18;
      ptVar14->address = uVar18 + *(int *)(puVar1 + (uVar28 + local_198) * 2 + 2);
      if (uVar10 == 0) {
        pcVar13 = "";
LAB_0011501b:
        if (0xc < uVar3) {
          value_from_data = th95_value_from_data;
          if ((version != 7) && (value_from_data = th95_value_from_data, version != 0x5f)) {
            if (version == 8) {
              value_from_data = th08_value_from_data;
            }
            else {
              value_from_data = th06_value_from_data;
            }
          }
          pvVar15 = value_list_from_data
                              (value_from_data,(uchar *)(puVar27 + 3),(ulong)uVar3 - 0xc,pcVar13);
          uVar18 = (uint)*(ushort *)((long)puVar27 + 10);
          for (pvVar22 = pvVar15; pvVar22->type != 0; pvVar22 = pvVar22 + 1) {
            ptVar16 = param_new((int)*pcVar13);
            uVar9 = *(undefined4 *)&pvVar22->field_0x4;
            dVar8 = (pvVar22->val).d;
            (ptVar16->value).type = pvVar22->type;
            *(undefined4 *)&(ptVar16->value).field_0x4 = uVar9;
            (ptVar16->value).val.d = dVar8;
            (ptVar16->value).val.m.data = (pvVar22->val).m.data;
            if ((version != 6) && ((uVar18 & 1) != 0)) {
              ptVar16->stack = 1;
            }
            uVar18 = uVar18 >> 1;
            list_append_new(&ptVar14->params,ptVar16);
            pcVar13 = pcVar13 + 1;
          }
          free(pvVar15);
        }
        list_append_new(plVar25,ptVar14);
      }
      else {
        pcVar13 = th06_find_format(version,(uint)uVar10,false);
        uVar3 = *(ushort *)((long)puVar27 + 6);
        if (pcVar13 != (char *)0x0) goto LAB_0011501b;
        fprintf(_stderr,"%-3d %04xB R%04x [%04x]: ",(ulong)(ushort)puVar27[1],(ulong)uVar3,
                (ulong)(ushort)puVar27[2],(ulong)*(ushort *)((long)puVar27 + 10));
        for (uVar19 = 0; uVar19 < (ulong)*(ushort *)((long)puVar27 + 6) - 0xc; uVar19 = uVar19 + 4)
        {
          fVar5 = *(float *)((long)puVar27 + uVar19 + 0xc);
          fprintf(_stderr," %08x (%d, %f)",(double)fVar5,(ulong)(uint)fVar5);
        }
        fputc(10,_stderr);
      }
    }
    list_append_new((list_t *)list_00,data);
    uVar19 = (ulong)*puVar1;
  }
  while (list_00 = list_00->next, list_00 != (list_node_t *)0x0) {
    list = (list_node_t *)((long)list_00->data + 0x38);
    plVar20 = list;
    while (plVar20 = plVar20->next, plVar20 != (list_node_t *)0x0) {
      pvVar6 = plVar20->data;
      plVar24 = (long *)((long)pvVar6 + 0x20);
LAB_00115152:
      plVar24 = (long *)*plVar24;
      if (plVar24 != (long *)0x0) {
        if (*(int *)plVar24[2] == 0x6f) {
          uVar23 = *(int *)((long)pvVar6 + 0x40) + ((int *)plVar24[2])[4];
          old = list;
          if (uVar23 == 0) {
            ptVar14 = thecl_instr_label(0);
            list_prepend_new((list_t *)list,ptVar14);
          }
          else {
            do {
              old = old->next;
              if (old == (list_node_t *)0x0) goto LAB_00115152;
            } while (*(int *)((long)old->data + 0x34) + *(int *)((long)old->data + 0x40) != uVar23);
            if (((old->next == (list_node_t *)0x0) ||
                (piVar7 = (int *)old->next->data, piVar7 == (int *)0x0)) || (*piVar7 != 3)) {
              ptVar14 = thecl_instr_label(uVar23);
              list_append_to((list_t *)list,ptVar14,old);
            }
          }
        }
        goto LAB_00115152;
      }
    }
  }
  uVar19 = 0;
LAB_001151ff:
  if (uVar19 == local_190) {
    file_munmap(map,length);
    return ptVar12;
  }
  uVar4 = 0;
  sprintf(name,"Timeline%zu");
  pcVar13 = (char *)malloc(0x110);
  strcpy(pcVar13,name);
  plVar25 = (list_t *)(pcVar13 + 0x100);
  list_init(plVar25);
  puVar21 = (ushort *)((ulong)*(uint *)(puVar1 + uVar19 * 2 + 2) + (long)map);
  bVar2 = (version < 8) - 1;
  do {
    uVar10 = *puVar21;
    if (version < 8) {
      if ((uVar10 == 0xffff) && (puVar21[1] == 4)) break;
    }
    else if (((uVar10 == 0xffff) && (puVar21[1] == 0xffff)) && ((char)puVar21[3] == '\0')) break;
    if (*(byte *)((long)puVar21 + 7) != bVar2) {
      ptVar14 = thecl_instr_rank((uint)*(byte *)((long)puVar21 + 7));
      list_append_new(plVar25,ptVar14);
      bVar2 = *(byte *)((long)puVar21 + 7);
      uVar10 = *puVar21;
    }
    if (uVar10 != uVar4) {
      ptVar14 = thecl_instr_time((uint)uVar10);
      list_append_new(plVar25,ptVar14);
      uVar4 = *puVar21;
    }
    ptVar14 = thecl_instr_new();
    ptVar14->size = (uint)(byte)puVar21[3];
    uVar10 = puVar21[2];
    ptVar14->id = (uint)uVar10;
    pcVar17 = th06_find_timeline_format(version,(uint)uVar10);
    if (pcVar17 == (char *)0x0) {
      fprintf(_stderr,"%-3d %04xB: ",(ulong)puVar21[2],(ulong)(byte)puVar21[3]);
      for (uVar28 = 0; uVar28 < (ulong)(byte)puVar21[3] - 8; uVar28 = uVar28 + 4) {
        fVar5 = *(float *)((long)puVar21 + uVar28 + 8);
        fprintf(_stderr," %08x (%d, %f)",(double)fVar5,(ulong)(uint)fVar5);
      }
      fputc(10,_stderr);
    }
    else {
      ptVar16 = param_new((int)*pcVar17);
      (ptVar16->value).val.u = puVar21[1];
      list_append_new(&ptVar14->params,ptVar16);
      if (8 < (ulong)(byte)puVar21[3]) {
        pvVar15 = value_list_from_data
                            (::value_from_data,(uchar *)(puVar21 + 4),(ulong)(byte)puVar21[3] - 8,
                             pcVar17 + 1);
        for (pvVar22 = pvVar15; pvVar22->type != 0; pvVar22 = pvVar22 + 1) {
          ptVar16 = param_new(pvVar22->type);
          uVar9 = *(undefined4 *)&pvVar22->field_0x4;
          dVar8 = (pvVar22->val).d;
          (ptVar16->value).type = pvVar22->type;
          *(undefined4 *)&(ptVar16->value).field_0x4 = uVar9;
          (ptVar16->value).val.d = dVar8;
          (ptVar16->value).val.m.data = (pvVar22->val).m.data;
          list_append_new(&ptVar14->params,ptVar16);
        }
        free(pvVar15);
      }
      list_append_new(plVar25,ptVar14);
    }
    puVar21 = (ushort *)((long)puVar21 + (ulong)(byte)puVar21[3]);
  } while( true );
  list_append_new(&ptVar12->timelines,pcVar13);
  uVar19 = uVar19 + 1;
  goto LAB_001151ff;
}

Assistant:

static thecl_t*
th06_open(
    FILE* stream,
    unsigned int version)
{
    long file_size;
    unsigned char* map;

    const th06_header_t* header;

    file_size = file_fsize(stream);
    if (file_size == -1)
        return NULL;

    map = file_mmap(stream, file_size);
    if (!map)
        return NULL;

    /* TODO: Check magic. */
    if (version >= 8)
        header = (th06_header_t*)(map + sizeof(uint32_t));
    else
        header = (th06_header_t*)map;

    size_t timeline_count;
    size_t timeline_count_max;
    if (version == 9) {
        timeline_count = header->timeline_count;
        timeline_count_max = header->timeline_count;
    } else if (version == 6) {
        timeline_count = 1;
        timeline_count_max = 3;
    } else {
        timeline_count = header->timeline_count;
        timeline_count_max = 16;
    }

    thecl_t* ecl = thecl_new();
    ecl->version = version;
    ecl->sub_count = header->sub_count;

    for (size_t s = 0; s < header->sub_count; ++s) {
        unsigned int rank = 0xff << 8;
        char name[256];
        thecl_sub_t* sub = malloc(sizeof(*sub));
        memset(sub, 0, sizeof(*sub));
        sprintf(name, "Sub%zu", s);
        sub->name = strdup(name);
        sub->format = NULL;
        list_init(&sub->instrs);
        list_init(&sub->labels);
        unsigned int time = 0;

        const void* raw_sub = map + header->offsets[timeline_count_max + s];
        const th06_instr_t* raw_instr = (th06_instr_t*)(raw_sub);
        while (raw_instr->time != 0xffffffff && raw_instr->size) {
            if (raw_instr->time != time) {
                thecl_instr_t* new = thecl_instr_time(raw_instr->time);
                new->offset = (ptrdiff_t)raw_instr - (ptrdiff_t)raw_sub;
                list_append_new(&sub->instrs, new);
                time = raw_instr->time;
            }

            if (raw_instr->rank_mask != rank) {
                uint16_t rank_mask = raw_instr->rank_mask >> 8;
                if (version == 6 || version == 7)
                    rank_mask |= 0xf0;
                thecl_instr_t* new = thecl_instr_rank(rank_mask & 0xff);
                new->offset = (ptrdiff_t)raw_instr - (ptrdiff_t)raw_sub;
                list_append_new(&sub->instrs, new);
                rank = raw_instr->rank_mask;
            }

            thecl_instr_t* instr = thecl_instr_new();
            instr->id = raw_instr->id;
            instr->size = raw_instr->size;
            instr->offset = (ptrdiff_t)raw_instr - (ptrdiff_t)raw_sub;
            instr->address = instr->offset + header->offsets[timeline_count_max + s];

            const char* format;

            if (raw_instr->id == 0)
                format = "";
            else
                format = th06_find_format(version, raw_instr->id, 0);

            if (!format) {
                fprintf(stderr, "%-3d %04xB R%04x [%04x]: ",
                    raw_instr->id,
                    raw_instr->size,
                    raw_instr->rank_mask,
                    raw_instr->param_mask
                );

                for (size_t d = 0; d < raw_instr->size - sizeof(th06_instr_t); d += 4) {
                    fprintf(stderr, " %08x (%d, %f)",
                        *(uint32_t*)(raw_instr->data + d),
                        *(int32_t*)(raw_instr->data + d),
                        *(float*)(raw_instr->data + d)
                        );
                }

                fprintf(stderr, "\n");
                goto next;
            }

            if (raw_instr->size > sizeof(th06_instr_t)) {
                value_t* values;
                if (version == 7 || version == 95)
                    values = value_list_from_data(th95_value_from_data, raw_instr->data, raw_instr->size - sizeof(th06_instr_t), format);
                else if (version == 8)
                    values = value_list_from_data(th08_value_from_data, raw_instr->data, raw_instr->size - sizeof(th06_instr_t), format);
                else
                    values = value_list_from_data(th06_value_from_data, raw_instr->data, raw_instr->size - sizeof(th06_instr_t), format);
                value_t* value_iter = values;
                uint16_t param_mask = raw_instr->param_mask;

                size_t p = 0;
                char f;
                while (value_iter->type) {
                    f = format[p];
                    thecl_param_t* param = param_new(f);
                    param->value = *value_iter;
                    if (version != 6 && param_mask & 1)
                        param->stack = 1;
                    param_mask >>= 1;
                    ++value_iter;
                    ++p;
                    list_append_new(&instr->params, param);
                }
                free(values);
            }

            list_append_new(&sub->instrs, instr);

next:
            raw_instr = (th06_instr_t*)((char*)raw_instr + raw_instr->size);
        }

        list_append_new(&ecl->subs, sub);
    }

    th06_insert_labels(ecl);

    thecl_timeline_t* timeline;

    for (size_t e = 0; e < timeline_count; ++e) {
        char name[128];
        sprintf(name, "Timeline%zu", e);

        timeline = malloc(sizeof(*timeline));
        strcpy(timeline->name, name);
        list_init(&timeline->instrs);

        uint16_t time = 0;
        uint8_t rank = version >= 8 ? 0xff : 0x00;
        th06_timeline_instr_t* raw_instr = (th06_timeline_instr_t*)(map + header->offsets[e]);
        while(!th06_check_timeline_sentinel(version, raw_instr)) {
            if (raw_instr->rank != rank) {
                thecl_instr_t* new = thecl_instr_rank(raw_instr->rank);
                list_append_new(&timeline->instrs, new);
                rank = raw_instr->rank;
            }
            if (raw_instr->time != time) {
                thecl_instr_t* new = thecl_instr_time(raw_instr->time);
                list_append_new(&timeline->instrs, new);
                time = raw_instr->time;
            }

            thecl_instr_t* instr = thecl_instr_new();
            instr->size = raw_instr->size;
            instr->id = raw_instr->id;

            const char* format = th06_find_timeline_format(version, raw_instr->id);

            if (!format) {
                fprintf(stderr, "%-3d %04xB: ",
                    raw_instr->id,
                    raw_instr->size
                    );

                for (size_t d = 0; d < raw_instr->size - sizeof(th06_timeline_instr_t); d += 4) {
                    fprintf(stderr, " %08x (%d, %f)",
                        *(uint32_t*)(raw_instr->data + d),
                        *(int32_t*)(raw_instr->data + d),
                        *(float*)(raw_instr->data + d)
                        );
                }

                fprintf(stderr, "\n");
            } else {
                thecl_param_t* param0 = param_new(format[0]);
                param0->value.val.s = raw_instr->arg0;
                list_append_new(&instr->params, param0);

                if (raw_instr->size > sizeof(th06_timeline_instr_t)) {
                    /* The first parameter is in the struct and is always s, so it needs to be ignored here. */
                    value_t* values = value_list_from_data(value_from_data, raw_instr->data, raw_instr->size - sizeof(th06_timeline_instr_t), format + 1);
                    value_t* value_iter = values;
                    while (value_iter->type) {
                        thecl_param_t* param = param_new(value_iter->type);
                        param->value = *value_iter;
                        ++value_iter;
                        list_append_new(&instr->params, param);
                    }
                    free(values);
                }

                list_append_new(&timeline->instrs, instr);
            }

            raw_instr = (th06_timeline_instr_t*)((char*)raw_instr + raw_instr->size);
        }

        list_append_new(&ecl->timelines, timeline);
    }

    file_munmap(map, file_size);

    return ecl;
}